

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O0

void __thiscall
supermap::Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long>::dropRamIndexToDisk
          (Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long> *this)

{
  int iVar1;
  pointer pEVar2;
  undefined4 extraout_var;
  type pEVar3;
  iterator iVar4;
  iterator iVar5;
  pointer pSVar6;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>
  *in_RDI;
  IndexStorageBase newBlock;
  vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
  newBlockKeyIndex;
  KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
  *in_stack_ffffffffffffff08;
  unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
  *in_stack_ffffffffffffff10;
  OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_unsigned_long,_void>
  *this_00;
  function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>_>_>_()>
  *__f;
  function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_&&)>
  *in_stack_ffffffffffffff28;
  undefined1 local_d0 [40];
  undefined1 local_a8 [32];
  string local_88 [16];
  Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long> *in_stack_ffffffffffffff88;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>
  local_58;
  function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>_>_>_()>
  local_20;
  
  pEVar2 = std::
           unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
           ::operator->((unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
                         *)0x2b1f15);
  iVar1 = (*(pEVar2->super_KeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>).
            _vptr_KeyValueStorage[3])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    pEVar3 = std::
             unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
             ::operator*(in_stack_ffffffffffffff10);
    __f = &local_20;
    (*(pEVar3->super_KeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>).
      _vptr_KeyValueStorage[6])();
    iVar4 = std::
            vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
            ::begin((vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
                     *)in_stack_ffffffffffffff08);
    iVar5 = std::
            vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
            ::end((vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
                   *)in_stack_ffffffffffffff08);
    Supermap<supermap::Key<2ul>,supermap::ByteArray<2ul>,unsigned_long>::getNewBlockName_abi_cxx11_
              (in_stack_ffffffffffffff88);
    std::
    unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
    ::operator->((unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
                  *)0x2b1f93);
    KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
    ::getFileManager(in_stack_ffffffffffffff08);
    std::
    function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>>>>()>
    ::
    function<std::function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,supermap::Key<2ul>>,std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,supermap::Key<2ul>>>>()>&,void>
              ((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>_()>
                *)in_RDI,__f);
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>,supermap::Key<2ul>>
    ::
    SortedSingleFileIndexedStorage<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>>>>,supermap::Supermap<supermap::Key<2ul>,supermap::ByteArray<2ul>,unsigned_long>::dropRamIndexToDisk()::_lambda(supermap::KeyValue<supermap::Key<2ul>,unsigned_long>const&,supermap::KeyValue<supermap::Key<2ul>,unsigned_long>const&)_1_,supermap::Supermap<supermap::Key<2ul>,supermap::ByteArray<2ul>,unsigned_long>::dropRamIndexToDisk()::_lambda(supermap::KeyValue<supermap::Key<2ul>,unsigned_long>const&,supermap::KeyValue<supermap::Key<2ul>,unsigned_long>const&)_2_>
              (&local_58,iVar4._M_current,iVar5._M_current,1,local_88,local_a8,local_d0);
    std::
    function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>_()>
    ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>_()>
                 *)0x2b1ff8);
    std::shared_ptr<supermap::io::FileManager>::~shared_ptr
              ((shared_ptr<supermap::io::FileManager> *)0x2b2002);
    std::__cxx11::string::~string(local_88);
    pSVar6 = std::
             unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_>
             ::operator->((unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_>
                           *)0x2b201a);
    this_00 = &pSVar6->
               super_OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_unsigned_long,_void>
    ;
    std::
    function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_&&)>
    ::operator()(in_stack_ffffffffffffff28,in_RDI);
    (**this_00->_vptr_OrderedStorage)(this_00,&stack0xffffffffffffff28);
    std::
    unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>
    ::~unique_ptr((unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>
                   *)this_00);
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>
    ::~SortedSingleFileIndexedStorage
              ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>
                *)0x2b206b);
    std::
    vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
    ::~vector((vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>_>
               *)in_RDI);
  }
  return;
}

Assistant:

void dropRamIndexToDisk() {
        if (innerStorage_->getUpperSizeBound() == 0) {
            return;
        }
        std::vector<KeyIndex> newBlockKeyIndex = std::move(*innerStorage_).extract();
        auto newBlock = IndexStorageBase(
            newBlockKeyIndex.begin(),
            newBlockKeyIndex.end(),
            true,
            getNewBlockName(),
            diskDataStorage_->getFileManager(),
            [](const KeyIndex &a, const KeyIndex &b) { return a.key < b.key; },
            [](const KeyIndex &a, const KeyIndex &b) { return a.key == b.key; },
            registerSupplier_
        );
        diskIndex_->append(keyIndexStorageSupplier_(std::move(newBlock)));
    }